

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O3

type_conflict2
jsoncons::detail::
encode_base64_generic<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__cxx11::wstring>
          (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           first,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 last,char *alphabet,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result)

{
  uint uVar1;
  int iVar2;
  long lVar4;
  wchar_t wVar5;
  ulong uVar6;
  type_conflict2 tVar7;
  uchar a3 [3];
  uchar a4 [4];
  byte local_3b [4];
  byte local_37;
  byte local_36;
  byte local_35;
  uint local_34;
  ulong uVar3;
  
  if (first._M_current == last._M_current) {
    tVar7 = 0;
  }
  else {
    local_34 = (uint)(byte)alphabet[0x40];
    tVar7 = 0;
    uVar6 = 0;
    do {
      uVar1 = (int)uVar6 + 1;
      uVar3 = (ulong)uVar1;
      local_3b[uVar6] = *first._M_current;
      wVar5 = (wchar_t)result;
      if (uVar1 == 3) {
        local_3b[3] = local_3b[0] >> 2;
        local_37 = (local_3b[0] & 3) << 4 | local_3b[1] >> 4;
        local_36 = (local_3b[1] & 0xf) << 2 | local_3b[2] >> 6;
        local_35 = local_3b[2] & 0x3f;
        lVar4 = 0;
        do {
          std::__cxx11::wstring::push_back(wVar5);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        tVar7 = tVar7 + 4;
        uVar3 = 0;
      }
      first._M_current = first._M_current + 1;
      uVar6 = uVar3;
    } while (first._M_current != last._M_current);
    uVar1 = (uint)uVar3;
    if (0 < (int)uVar1) {
      if (uVar1 < 3) {
        memset(local_3b + uVar3,0,(ulong)(3 - uVar1));
      }
      local_3b[3] = local_3b[0] >> 2;
      local_37 = (local_3b[0] & 3) << 4 | local_3b[1] >> 4;
      local_36 = (local_3b[1] & 0xf) << 2 | local_3b[2] >> 6;
      uVar6 = 0;
      do {
        std::__cxx11::wstring::push_back(wVar5);
        uVar6 = uVar6 + 1;
      } while (uVar1 + 1 != uVar6);
      tVar7 = tVar7 + uVar3 + 1;
      if (local_34 != 0 && uVar1 < 3) {
        iVar2 = uVar1 - 3;
        do {
          std::__cxx11::wstring::push_back(wVar5);
          tVar7 = tVar7 + 1;
          iVar2 = iVar2 + 1;
        } while (iVar2 != 0);
      }
    }
  }
  return tVar7;
}

Assistant:

typename std::enable_if<std::is_same<typename std::iterator_traits<InputIt>::value_type,uint8_t>::value,size_t>::type
    encode_base64_generic(InputIt first, InputIt last, const char alphabet[65], Container& result)
    {
        std::size_t count = 0;
        unsigned char a3[3];
        unsigned char a4[4];
        unsigned char fill = alphabet[64];
        int i = 0;
        int j = 0;

        while (first != last)
        {
            a3[i++] = *first++;
            if (i == 3)
            {
                a4[0] = (a3[0] & 0xfc) >> 2;
                a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
                a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);
                a4[3] = a3[2] & 0x3f;

                for (i = 0; i < 4; i++) 
                {
                    result.push_back(alphabet[a4[i]]);
                    ++count;
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = i; j < 3; ++j) 
            {
                a3[j] = 0;
            }

            a4[0] = (a3[0] & 0xfc) >> 2;
            a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
            a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);

            for (j = 0; j < i + 1; ++j) 
            {
                result.push_back(alphabet[a4[j]]);
                ++count;
            }

            if (fill != 0)
            {
                while (i++ < 3) 
                {
                    result.push_back(fill);
                    ++count;
                }
            }
        }

        return count;
    }